

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_module.cpp
# Opt level: O2

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::BuildModule
          (spvtools *this,spv_target_env env,MessageConsumer *consumer,string *text,
          uint32_t assemble_options)

{
  bool bVar1;
  SpirvTools t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  
  SpirvTools::SpirvTools(&t,env);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&local_50,consumer);
  SpirvTools::SetMessageConsumer(&t,(MessageConsumer *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = SpirvTools::Assemble(&t,text,&binary,assemble_options);
  if (bVar1) {
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
              *)&local_70,consumer);
    BuildModule(this,env,(MessageConsumer *)&local_70,
                binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start >> 2);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  SpirvTools::~SpirvTools(&t);
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opt::IRContext> BuildModule(spv_target_env env,
                                            MessageConsumer consumer,
                                            const std::string& text,
                                            uint32_t assemble_options) {
  SpirvTools t(env);
  t.SetMessageConsumer(consumer);
  std::vector<uint32_t> binary;
  if (!t.Assemble(text, &binary, assemble_options)) return nullptr;
  return BuildModule(env, consumer, binary.data(), binary.size());
}